

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O1

void __thiscall Object_Nested_Test<char>::TestBody(Object_Nested_Test<char> *this)

{
  undefined1 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  allocator_type *__a;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *extraout_RDX_05;
  void *extraout_RDX_06;
  void *extraout_RDX_07;
  void *extraout_RDX_08;
  void *extraout_RDX_09;
  void *__buf;
  char *pcVar2;
  long lVar3;
  initializer_list<pstore::dump::object::member> __l;
  initializer_list<pstore::dump::object::member> __l_00;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  __string_type actual;
  object v;
  undefined1 local_249;
  undefined1 local_248 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  string *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  value_ptr local_1d8;
  undefined1 local_1c8 [32];
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_1a8;
  value_ptr local_188;
  value_ptr local_178;
  value_ptr local_168;
  string local_158;
  char *local_138;
  undefined1 local_130 [48];
  member local_100;
  member local_d0;
  member local_a0;
  undefined1 local_70 [8];
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_68;
  undefined1 local_50;
  vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_> local_48;
  
  local_248 = (undefined1  [8])&local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"k1","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"value1","");
  local_130._0_8_ = (string *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::dump::string,std::allocator<pstore::dump::string>,std::__cxx11::string_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_130 + 8),(string **)local_130,
             (allocator<pstore::dump::string> *)&local_228,&local_208);
  local_168.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_130._0_8_;
  local_168.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_130._8_8_ + 8) = *(_Atomic_word *)(local_130._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_130._8_8_ + 8) = *(_Atomic_word *)(local_130._8_8_ + 8) + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
  }
  pstore::dump::object::member::member(&local_d0,(string *)local_248,&local_168);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"k2","");
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"ik1","");
  local_1e8 = (string *)0x1b257a;
  local_1c8._0_8_ = (string *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::dump::string,std::allocator<pstore::dump::string>,char_const*&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1c8 + 8),(string **)local_1c8,
             (allocator<pstore::dump::string> *)&local_1d8,(char **)&local_1e8);
  local_188.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_1c8._0_8_;
  local_188.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_1c8._8_8_ + 8) = *(_Atomic_word *)(local_1c8._8_8_ + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_1c8._8_8_ + 8) = *(_Atomic_word *)(local_1c8._8_8_ + 8) + 1;
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1c8._8_8_);
  }
  pstore::dump::object::member::member((member *)local_130,&local_158,&local_188);
  local_1c8._0_8_ = (string *)(local_1c8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"ik2","");
  local_138 = "iv2";
  local_1e8 = (string *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<pstore::dump::string,std::allocator<pstore::dump::string>,char_const*&>
            (&local_1e0,&local_1e8,(allocator<pstore::dump::string> *)&local_249,&local_138);
  local_1d8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_1e8->super_value;
  local_1d8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_1e0._M_pi;
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_1e0._M_pi)->_M_use_count = (local_1e0._M_pi)->_M_use_count + 1;
    }
  }
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  pstore::dump::object::member::member(&local_100,(string *)local_1c8,&local_1d8);
  __l._M_len = 2;
  __l._M_array = (iterator)local_130;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_1a8,__l,(allocator_type *)&local_1e8);
  local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  (local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_use_count = 1;
  (local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_M_weak_count = 1;
  (local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
  ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001f1120;
  local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       (local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi + 1);
  local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
  ._vptr__Sp_counted_base = (_func_int **)&PTR__object_001f5ba0;
  *(pointer *)
   &local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [1]._M_use_count =
       local_1a8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[2]
  ._vptr__Sp_counted_base =
       (_func_int **)
       local_1a8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   &local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [2]._M_use_count =
       local_1a8.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   &local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    [3]._vptr__Sp_counted_base = 0;
  if (__libc_single_threaded == '\0') {
    LOCK();
    (local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count =
         (local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi)->_M_use_count + 1;
    UNLOCK();
  }
  else {
    (local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )->_M_use_count = 2;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
            (local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  pstore::dump::object::member::member(&local_a0,&local_228,&local_178);
  __a = (allocator_type *)&local_138;
  __l_00._M_len = 2;
  __l_00._M_array = &local_d0;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::vector
            (&local_48,__l_00,__a);
  local_70 = (undefined1  [8])&PTR__object_001f5ba0;
  local_68.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_68.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = 0;
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_48);
  lVar3 = 0;
  do {
    if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_70 + lVar3 + -8) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_70 + lVar3 + -8));
    }
    puVar1 = *(undefined1 **)((long)&local_a0.property._M_dataplus._M_p + lVar3);
    if (local_70 + lVar3 + -0x20 != puVar1) {
      operator_delete(puVar1,*(long *)(local_70 + lVar3 + -0x20) + 1);
    }
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x60);
  if (local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_178.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_1a8);
  lVar3 = 0;
  __buf = extraout_RDX;
  do {
    this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((long)&local_100.val.
                       super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + lVar3);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      __buf = extraout_RDX_00;
    }
    pcVar2 = *(char **)((long)&local_100.property._M_dataplus._M_p + lVar3);
    if (local_100.property.field_2._M_local_buf + lVar3 != pcVar2) {
      operator_delete(pcVar2,*(long *)((long)&local_100.property.field_2 + lVar3) + 1);
      __buf = extraout_RDX_01;
    }
    lVar3 = lVar3 + -0x30;
  } while (lVar3 != -0x60);
  if (local_1d8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1d8.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    __buf = extraout_RDX_02;
  }
  if ((string *)local_1c8._0_8_ != (string *)(local_1c8 + 0x10)) {
    operator_delete((void *)local_1c8._0_8_,local_1c8._16_8_ + 1);
    __buf = extraout_RDX_03;
  }
  if (local_188.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    __buf = extraout_RDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_05;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_06;
  }
  if (local_168.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_168.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    __buf = extraout_RDX_07;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    __buf = extraout_RDX_08;
  }
  if (local_248 != (undefined1  [8])&local_238) {
    operator_delete((void *)local_248,local_238._M_allocated_capacity + 1);
    __buf = extraout_RDX_09;
  }
  pstore::dump::value::write((value *)local_70,(int)this + 0x10,__buf,(size_t)__a);
  std::__cxx11::stringbuf::str();
  convert<char>((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
                "k1 : value1\nk2 : \n    ik1 : iv1\n    ik2 : iv2");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_248,"expected","actual",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_130,
             &local_d0.property);
  if (local_248[0] == (string)0x0) {
    testing::Message::Message((Message *)&local_208);
    if (local_240 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_240->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_object.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_228,(Message *)&local_208);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_228);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_208._M_dataplus._M_p + 8))();
    }
  }
  if (local_240 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_240,local_240);
  }
  if ((string *)local_130._0_8_ != (string *)(local_130 + 0x10)) {
    operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.property._M_dataplus._M_p != &local_d0.property.field_2) {
    operator_delete(local_d0.property._M_dataplus._M_p,
                    local_d0.property.field_2._M_allocated_capacity + 1);
  }
  std::vector<pstore::dump::object::member,_std::allocator<pstore::dump::object::member>_>::~vector
            (&local_68);
  pstore::dump::number_base::~number_base((number_base *)local_70);
  return;
}

Assistant:

TYPED_TEST (Object, Nested) {
    using namespace ::pstore::dump;
    object v{{
        {"k1", make_value (std::string ("value1"))},
        {"k2", make_value (object::container{
                   {"ik1", make_value ("iv1")},
                   {"ik2", make_value ("iv2")},
               })},
    }};
    v.write (this->out);
    auto const actual = this->out.str ();
    auto const expected = convert<TypeParam> ("k1 : value1\n"
                                              "k2 : \n"
                                              "    ik1 : iv1\n"
                                              "    ik2 : iv2");
    EXPECT_EQ (expected, actual);
}